

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepare.cc
# Opt level: O1

void __thiscall re2c::DFA::split(DFA *this,State *s)

{
  Initial *pIVar1;
  label_t lVar2;
  State *s_00;
  Span *pSVar3;
  
  s_00 = (State *)operator_new(0x58);
  lVar2 = label_t::first();
  (s_00->label).value = lVar2.value;
  s_00->rule = (RuleOp *)0x0;
  s_00->next = (State *)0x0;
  *(undefined8 *)((long)&s_00->next + 2) = 0;
  *(undefined8 *)((long)&s_00->fill + 2) = 0;
  Go::Go(&s_00->go);
  (s_00->action).type = MATCH;
  (s_00->action).info.initial = (Initial *)0x0;
  addState(this,s_00,s);
  if (((s_00->action).type == INITIAL) &&
     (pIVar1 = (s_00->action).info.initial, pIVar1 != (Initial *)0x0)) {
    operator_delete(pIVar1,8);
  }
  (s_00->action).type = MOVE;
  s_00->rule = s->rule;
  s_00->fill = s->fill;
  (s_00->go).nSpans = (s->go).nSpans;
  (s_00->go).span = (s->go).span;
  (s_00->go).type = (s->go).type;
  (s_00->go).info = (s->go).info;
  s->rule = (RuleOp *)0x0;
  (s->go).nSpans = 1;
  pSVar3 = (Span *)operator_new(0x10);
  (s->go).span = pSVar3;
  pSVar3->ub = this->ubChar;
  pSVar3->to = s_00;
  return;
}

Assistant:

void DFA::split(State *s)
{
	State *move = new State;
	addState(move, s);
	move->action.set_move ();
	move->rule = s->rule;
	move->fill = s->fill;
	move->go = s->go;
	s->rule = NULL;
	s->go.nSpans = 1;
	s->go.span = allocate<Span> (1);
	s->go.span[0].ub = ubChar;
	s->go.span[0].to = move;
}